

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http1.c
# Opt level: O0

int http1_upgrade2sse(http_s *h,http_sse_s *sse)

{
  FIOBJ FVar1;
  http_sse_s *phVar2;
  FIOBJ FVar3;
  fio_protocol_s *__dest;
  undefined8 local_68;
  code *local_60;
  code *local_58;
  code *local_50;
  code *local_48;
  undefined8 local_40;
  void *local_38;
  fio_protocol_s *local_30;
  http1_sse_fio_protocol_s *sse_pr;
  intptr_t uuid;
  http_sse_s *sse_local;
  http_s *h_local;
  
  sse_pr = *(http1_sse_fio_protocol_s **)((h->private_data).flag + 0x30);
  h->status = 200;
  FVar1 = HTTP_HEADER_CONTENT_TYPE;
  uuid = (intptr_t)sse;
  sse_local = (http_sse_s *)h;
  FVar3 = fiobj_dup(HTTP_HVALUE_SSE_MIME);
  http_set_header(h,FVar1,FVar3);
  phVar2 = sse_local;
  FVar1 = HTTP_HEADER_CACHE_CONTROL;
  FVar3 = fiobj_dup(HTTP_HVALUE_NO_CACHE);
  http_set_header((http_s *)phVar2,FVar1,FVar3);
  phVar2 = sse_local;
  FVar1 = HTTP_HEADER_CONTENT_ENCODING;
  FVar3 = fiobj_str_new("identity",8);
  http_set_header((http_s *)phVar2,FVar1,FVar3);
  sse_local->on_ready[0x102] = (code)0x1;
  htt1p_finish((http_s *)sse_local);
  __dest = (fio_protocol_s *)fio_malloc(0x38);
  local_30 = __dest;
  if (__dest != (fio_protocol_s *)0x0) {
    local_68 = 0;
    local_60 = http1_sse_on_ready;
    local_58 = http1_sse_on_shutdown;
    local_50 = http1_sse_on_close;
    local_48 = http1_sse_ping;
    local_40 = 0;
    local_38 = fio_malloc(0x68);
    memcpy(__dest,&local_68,0x38);
    if (local_30[1].on_data != (_func_void_intptr_t_fio_protocol_s_ptr *)0x0) {
      http_sse_init((http_sse_internal_s *)local_30[1].on_data,(intptr_t)sse_pr,&HTTP1_VTABLE,
                    (http_sse_s *)uuid);
      fio_timeout_set((intptr_t)sse_pr,*(uint8_t *)(*(long *)(sse_local->on_ready + 0x38) + 0x79));
      if (*(long *)uuid != 0) {
        (**(code **)uuid)(local_30[1].on_data);
      }
      fio_attach((intptr_t)sse_pr,local_30);
      return 0;
    }
  }
  fio_close(*(intptr_t *)(sse_local->on_ready + 0x30));
  if (*(long *)(uuid + 0x18) != 0) {
    (**(code **)(uuid + 0x18))(uuid);
  }
  return -1;
}

Assistant:

static int http1_upgrade2sse(http_s *h, http_sse_s *sse) {
  const intptr_t uuid = handle2pr(h)->p.uuid;
  /* send response */
  h->status = 200;
  http_set_header(h, HTTP_HEADER_CONTENT_TYPE, fiobj_dup(HTTP_HVALUE_SSE_MIME));
  http_set_header(h, HTTP_HEADER_CACHE_CONTROL,
                  fiobj_dup(HTTP_HVALUE_NO_CACHE));
  http_set_header(h, HTTP_HEADER_CONTENT_ENCODING,
                  fiobj_str_new("identity", 8));
  handle2pr(h)->stop = 1;
  htt1p_finish(h); /* avoid the enforced content length in http_finish */

  /* switch protocol to SSE */
  http1_sse_fio_protocol_s *sse_pr = fio_malloc(sizeof(*sse_pr));
  if (!sse_pr)
    goto failed;
  *sse_pr = (http1_sse_fio_protocol_s){
      .p =
          {
              .on_ready = http1_sse_on_ready,
              .on_shutdown = http1_sse_on_shutdown,
              .on_close = http1_sse_on_close,
              .ping = http1_sse_ping,
          },
      .sse = fio_malloc(sizeof(*(sse_pr->sse))),
  };

  if (!sse_pr->sse)
    goto failed;

  http_sse_init(sse_pr->sse, uuid, &HTTP1_VTABLE, sse);
  fio_timeout_set(uuid, handle2pr(h)->p.settings->ws_timeout);
  if (sse->on_open)
    sse->on_open(&sse_pr->sse->sse);
  fio_attach(uuid, &sse_pr->p);
  return 0;

failed:
  fio_close(handle2pr(h)->p.uuid);
  if (sse->on_close)
    sse->on_close(sse);
  return -1;
  (void)sse;
}